

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part_specifier.cpp
# Opt level: O2

DatePartSpecifier duckdb::GetDatePartSpecifier(string *specifier)

{
  ConversionException *this;
  bool bVar1;
  DatePartSpecifier result;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = TryGetDatePartSpecifier(specifier,&result);
  if (bVar1) {
    return result;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"extract specifier \"%s\" not recognized",&local_59);
  ::std::__cxx11::string::string((string *)&local_58,(string *)specifier);
  ConversionException::ConversionException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DatePartSpecifier GetDatePartSpecifier(const string &specifier) {
	DatePartSpecifier result;
	if (!TryGetDatePartSpecifier(specifier, result)) {
		throw ConversionException("extract specifier \"%s\" not recognized", specifier);
	}
	return result;
}